

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::TSPI_PDU::SetDeadReckoningParameterFlag(TSPI_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  short sVar2;
  
  if ((((this->m_TSPIFlagUnion).m_ui8Flag & 0x10) == 0) == F) {
    sVar2 = -7;
    if (F) {
      sVar2 = 7;
    }
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xef | F << 4;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + sVar2;
  }
  return;
}

Assistant:

void TSPI_PDU::SetDeadReckoningParameterFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8DRM )return;

    m_TSPIFlagUnion.m_ui8DRM = F;

    if( F )
    {
        m_ui16PDULength += LE_DeadReckoningParameter::LE_DEAD_RECKONING_PARAMETER_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_DeadReckoningParameter::LE_DEAD_RECKONING_PARAMETER_SIZE;
    }
}